

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

uchar __thiscall YAML::Stream::GetNextByte(Stream *this)

{
  long *plVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = this->m_nPrefetchedUsed;
  if (this->m_nPrefetchedAvailable <= uVar3) {
    plVar1 = *(long **)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0xe8);
    sVar2 = (**(code **)(*plVar1 + 0x40))(plVar1,this->m_pPrefetched,0x800);
    this->m_nPrefetchedAvailable = sVar2;
    this->m_nPrefetchedUsed = 0;
    if ((sVar2 == 0) &&
       (std::ios::clear((int)this->m_input + (int)*(undefined8 *)(*(long *)this->m_input + -0x18)),
       this->m_nPrefetchedAvailable == 0)) {
      return '\0';
    }
    uVar3 = this->m_nPrefetchedUsed;
  }
  this->m_nPrefetchedUsed = uVar3 + 1;
  return this->m_pPrefetched[uVar3];
}

Assistant:

unsigned char Stream::GetNextByte() const {
  if (m_nPrefetchedUsed >= m_nPrefetchedAvailable) {
    std::streambuf* pBuf = m_input.rdbuf();
    m_nPrefetchedAvailable = static_cast<std::size_t>(
        pBuf->sgetn(ReadBuffer(m_pPrefetched), YAML_PREFETCH_SIZE));
    m_nPrefetchedUsed = 0;
    if (!m_nPrefetchedAvailable) {
      m_input.setstate(std::ios_base::eofbit);
    }

    if (0 == m_nPrefetchedAvailable) {
      return 0;
    }
  }

  return m_pPrefetched[m_nPrefetchedUsed++];
}